

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmulNet.cpp
# Opt level: O0

EmulNet * __thiscall EmulNet::operator=(EmulNet *this,EmulNet *anotherEmulNet)

{
  int local_20;
  int local_1c;
  int j;
  int i;
  EmulNet *anotherEmulNet_local;
  EmulNet *this_local;
  
  this->par = anotherEmulNet->par;
  this->enInited = anotherEmulNet->enInited;
  for (local_1c = 0; local_1c < 1000; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 0xe10; local_20 = local_20 + 1) {
      this->sent_msgs[local_1c][local_20] = anotherEmulNet->sent_msgs[local_1c][local_20];
      this->recv_msgs[local_1c][local_20] = anotherEmulNet->recv_msgs[local_1c][local_20];
    }
  }
  EM::operator=(&this->emulnet,&anotherEmulNet->emulnet);
  return this;
}

Assistant:

EmulNet& EmulNet::operator =(EmulNet &anotherEmulNet) {
	int i, j;
	this->par = anotherEmulNet.par;
	this->enInited = anotherEmulNet.enInited;
	for ( i = 0; i < MAX_NODES; i++ ) {
		for ( j = 0; j < MAX_TIME; j++ ) {
			this->sent_msgs[i][j] = anotherEmulNet.sent_msgs[i][j];
			this->recv_msgs[i][j] = anotherEmulNet.recv_msgs[i][j];
		}
	}
	this->emulnet = anotherEmulNet.emulnet;
	return *this;
}